

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void cashew::ValueBuilder::appendToObjectAsSetter(Ref array,IString key,IString param,Ref value)

{
  Value *this;
  bool bVar1;
  Ref *pRVar2;
  Ref RVar3;
  Ref RVar4;
  Ref r;
  Value *pVVar5;
  undefined1 local_50 [8];
  IString key_local;
  IString param_local;
  Ref array_local;
  
  key_local.str._M_len = (size_t)key.str._M_str;
  local_50 = (undefined1  [8])key.str._M_len;
  param_local.str._M_len = (size_t)param.str._M_str;
  key_local.str._M_str = (char *)param.str._M_len;
  param_local.str._M_str = (char *)array.inst;
  pRVar2 = Ref::operator[]((Ref *)&param_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)OBJECT);
  if (bVar1) {
    pRVar2 = Ref::operator[]((Ref *)&param_local.str._M_str,1);
    this = pRVar2->inst;
    RVar3 = makeRawArray(2);
    RVar4 = makeRawArray(3);
    r = makeRawString((IString *)SETTER);
    pVVar5 = cashew::Value::push_back(RVar4.inst,r);
    RVar4 = makeRawString((IString *)local_50);
    pVVar5 = cashew::Value::push_back(pVVar5,RVar4);
    RVar4 = makeRawString((IString *)&key_local.str._M_str);
    RVar4.inst = cashew::Value::push_back(pVVar5,RVar4);
    pVVar5 = cashew::Value::push_back(RVar3.inst,RVar4);
    RVar3.inst = cashew::Value::push_back(pVVar5,value);
    cashew::Value::push_back(this,RVar3);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x743,
                "static void cashew::ValueBuilder::appendToObjectAsSetter(Ref, IString, IString, Ref)"
               );
}

Assistant:

static void
  appendToObjectAsSetter(Ref array, IString key, IString param, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(3)
                                          ->push_back(makeRawString(SETTER))
                                          .push_back(makeRawString(key))
                                          .push_back(makeRawString(param)))
                           .push_back(value));
  }